

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_test_cases.cpp
# Opt level: O2

void flat_forward_list_validate_array_test1<5ul>
               (char *title,bool expected_to_be_valid,FLAT_FORWARD_LIST_TEST (*a) [5])

{
  default_validate_element_fn<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  *in_R8;
  char local_51;
  undefined1 local_50 [16];
  pair<bool,_iffl::flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>_>
  local_40;
  
  printf("-----\"%s\"-----\n",title);
  iffl::
  flat_forward_list_validate_has_next_offset<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,iffl::default_validate_element_fn<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>>
            (&local_40,(iffl *)a,(char *)(a + 1),&local_51,in_R8);
  if (local_40.first == expected_to_be_valid) {
    if (local_40.first != false) {
      iffl::
      flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
      ::begin((flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
               *)(local_50 + 8));
      iffl::
      flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
      ::end((flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
             *)local_50);
      std::
      for_each<iffl::flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>,flat_forward_list_validate_array_test1<5ul>(char_const*,bool,_FLAT_FORWARD_LIST_TEST_const(&)[5ul])::_lambda(_FLAT_FORWARD_LIST_TEST_const&)_1_>
                ((flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                  *)(local_50 + 8),
                 (flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                  *)local_50);
    }
    return;
  }
  std::terminate();
}

Assistant:

void flat_forward_list_validate_array_test1(char const * title, bool expected_to_be_valid, FLAT_FORWARD_LIST_TEST const (&a)[N]) {
    std::printf("-----\"%s\"-----\n", title);
    auto[is_valid, buffer_view] = iffl::flat_forward_list_validate(a, a + N);
    FFL_CODDING_ERROR_IF_NOT(is_valid == expected_to_be_valid);

    if (is_valid) {
        std::for_each(buffer_view.begin(), 
                      buffer_view.end(), 
                      [](FLAT_FORWARD_LIST_TEST const &e) noexcept {
            print_element(e);
        });
    }
}